

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreCollectionTest_NoStores_Test>::CreateTest
          (TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreCollectionTest_NoStores_Test>
           *this)

{
  TrustStoreCollectionTest *this_00;
  
  this_00 = (TrustStoreCollectionTest *)operator_new(0x70);
  bssl::anon_unknown_0::TrustStoreCollectionTest::TrustStoreCollectionTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TrustStoreCollectionTest_005b1ea8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }